

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Formatter::make_option_usage_abi_cxx11_(Formatter *this,Option *opt)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  Option *in_RDX;
  long *in_RSI;
  string *in_RDI;
  stringstream out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  string *__lhs;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  Option *local_18;
  
  __lhs = in_RDI;
  local_18 = in_RDX;
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  (**(code **)(*in_RSI + 0x60))(local_1c0,in_RSI,local_18,1);
  ::std::operator<<(local_190,local_1c0);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffdc0);
  iVar2 = Option::get_expected_max(local_18);
  if (iVar2 < 0x20000000) {
    iVar2 = Option::get_expected_max(local_18);
    if (1 < iVar2) {
      in_stack_fffffffffffffdc0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ::std::operator<<(local_190,"(");
      iVar2 = Option::get_expected(local_18);
      poVar3 = (ostream *)::std::ostream::operator<<(in_stack_fffffffffffffdc0,iVar2);
      ::std::operator<<(poVar3,"x)");
    }
  }
  else {
    ::std::operator<<(local_190,"...");
  }
  bVar1 = OptionBase<CLI::Option>::get_required(&local_18->super_OptionBase<CLI::Option>);
  if (bVar1) {
    ::std::__cxx11::stringstream::str();
  }
  else {
    ::std::__cxx11::stringstream::str();
    ::std::operator+((char *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdc0);
    ::std::operator+(__lhs,(char *)in_stack_fffffffffffffdc0);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffdc0);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffdc0);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string Formatter::make_option_usage(const Option *opt) const {
    // Note that these are positionals usages
    std::stringstream out;
    out << make_option_name(opt, true);
    if(opt->get_expected_max() >= detail::expected_max_vector_size)
        out << "...";
    else if(opt->get_expected_max() > 1)
        out << "(" << opt->get_expected() << "x)";

    return opt->get_required() ? out.str() : "[" + out.str() + "]";
}